

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.cpp
# Opt level: O2

void __thiscall TimerTest_syncrhonizedTimers_Test::TestBody(TimerTest_syncrhonizedTimers_Test *this)

{
  char *pcVar1;
  int timers_running;
  int local_b8;
  undefined4 uStack_b4;
  unique_lock<std::mutex> lock;
  AssertHelper local_a0 [8];
  _Any_data local_98;
  code *local_88;
  code *pcStack_80;
  syncrhonized_timer timer_obj;
  mutex notifier_mutex;
  condition_variable notifier;
  
  std::condition_variable::condition_variable(&notifier);
  notifier_mutex.super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  timers_running = 0;
  notifier_mutex.super___mutex_base._M_mutex._16_8_ = 0;
  notifier_mutex.super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  notifier_mutex.super___mutex_base._M_mutex.__align = 0;
  notifier_mutex.super___mutex_base._M_mutex._8_8_ = 0;
  local_98._M_unused._M_object = (void *)0x0;
  local_98._8_8_ = 0;
  local_88 = (code *)0x0;
  pcStack_80 = (code *)0x0;
  local_98._M_unused._M_object = operator_new(0x18);
  *(condition_variable **)local_98._M_unused._0_8_ = &notifier;
  *(mutex **)((long)local_98._M_unused._0_8_ + 8) = &notifier_mutex;
  *(int **)((long)local_98._M_unused._0_8_ + 0x10) = &timers_running;
  pcStack_80 = std::
               _Function_handler<void_(jessilib::timer_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/timer.cpp:196:39)>
               ::_M_invoke;
  local_88 = std::
             _Function_handler<void_(jessilib::timer_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/timer.cpp:196:39)>
             ::_M_manager;
  jessilib::syncrhonized_timer::syncrhonized_timer(&timer_obj,1000000);
  std::_Function_base::~_Function_base((_Function_base *)&local_98);
  lock._M_device = (mutex_type *)0x2dc6c0;
  std::this_thread::sleep_for<long,std::ratio<1l,1000000000l>>
            ((duration<long,_std::ratio<1L,_1000000000L>_> *)&lock);
  local_b8 = 1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&lock,"timers_running","1",&timers_running,&local_b8);
  if ((char)lock._M_device == '\0') {
    testing::Message::Message((Message *)&local_b8);
    if (lock._8_8_ == 0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)lock._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/timer.cpp"
               ,0xd3,pcVar1);
    testing::internal::AssertHelper::operator=(local_a0,(Message *)&local_b8);
    testing::internal::AssertHelper::~AssertHelper(local_a0);
    if ((long *)CONCAT44(uStack_b4,local_b8) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(uStack_b4,local_b8) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&lock._M_owns);
  std::condition_variable::notify_all();
  std::unique_lock<std::mutex>::unique_lock(&lock,&notifier_mutex);
  while (timers_running != 0) {
    std::condition_variable::wait((unique_lock *)&notifier);
  }
  std::unique_lock<std::mutex>::~unique_lock(&lock);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&timer_obj.super_timer.m_context.
              super___shared_ptr<jessilib::impl::timer_context,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::condition_variable::~condition_variable(&notifier);
  return;
}

Assistant:

TEST(TimerTest, syncrhonizedTimers) {
	std::condition_variable notifier;
	std::mutex notifier_mutex;
	int timers_running = 0;

	// Spin up timer
	syncrhonized_timer timer_obj{period, [&notifier, &notifier_mutex, &timers_running](timer& in_timer) {
		std::unique_lock<std::mutex> lock(notifier_mutex);
		++timers_running;

		// Wait for a few more timer periods to pass before proceeding
		notifier.wait(lock);

		// We're done here; cancel
		--timers_running;
		notifier.notify_one();
		in_timer.cancel();
	}};

	// Wait for some timers to fire
	std::this_thread::sleep_for(period * 3);
	EXPECT_EQ(timers_running, 1);

	// Notify timers to close
	notifier.notify_all();

	// Wait for timers to complete
	std::unique_lock<std::mutex> lock(notifier_mutex);
	notifier.wait(lock, [&timers_running]() {
		return timers_running == 0;
	});
}